

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

TString * glslang::getNameForIdMap_abi_cxx11_(TIntermSymbol *symbol)

{
  _func_int **pp_Var1;
  int iVar2;
  TShaderInterface TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TString *pTVar4;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  TVar3 = TType::getShaderInterface((TType *)CONCAT44(extraout_var,iVar2));
  pp_Var1 = (symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
  if (TVar3 == EsiNone) {
    iVar2 = (*pp_Var1[0x32])();
    return (TString *)CONCAT44(extraout_var_00,iVar2);
  }
  iVar2 = (*pp_Var1[0x1e])(symbol);
  pTVar4 = (TString *)
           (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))
                     ((long *)CONCAT44(extraout_var_01,iVar2));
  return pTVar4;
}

Assistant:

static const TString& getNameForIdMap(TIntermSymbol* symbol)
{
    TShaderInterface si = symbol->getType().getShaderInterface();
    if (si == EsiNone)
        return symbol->getName();
    else
        return symbol->getType().getTypeName();
}